

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

bool __thiscall
glslang::TIntermediate::isFPPromotion(TIntermediate *this,TBasicType from,TBasicType to)

{
  return (from - EbtFloat & 0xfffffffd) == 0 && to == EbtDouble;
}

Assistant:

bool TIntermediate::isFPPromotion(TBasicType from, TBasicType to) const
{
    // floating-point promotions
    if (to == EbtDouble) {
        switch(from) {
        case EbtFloat16:
        case EbtFloat:
            return true;
        default:
            break;
        }
    }
    return false;
}